

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

uint32_t inform_dist_tick(inform_dist *dist,size_t event)

{
  size_t event_local;
  inform_dist *dist_local;
  
  if ((dist == (inform_dist *)0x0) || (dist->size <= event)) {
    dist_local._4_4_ = 0;
  }
  else {
    dist->counts = dist->counts + 1;
    dist_local._4_4_ = dist->histogram[event] + 1;
    dist->histogram[event] = dist_local._4_4_;
  }
  return dist_local._4_4_;
}

Assistant:

uint32_t inform_dist_tick(inform_dist *dist, size_t event)
{
    // if the distribution is NULL or the event is outsize of the support
    if (dist == NULL || event >= dist->size)
    {
        return 0;
    }
    // increment counts by one
    dist->counts += 1;
    // increment by one and return the new number of occurances of the event
    return (dist->histogram[event] += 1);
}